

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

int __thiscall kj::anon_unknown_8::DiskHandle::stat(DiskHandle *this,char *__file,stat *__buf)

{
  int iVar1;
  Type TVar2;
  Fault f;
  stat stats;
  Fault local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  stat local_a8;
  
  do {
    iVar1 = fstat(*(int *)__file,&local_a8);
    if (-1 < iVar1) goto LAB_00215d30;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_c0.exception = (Exception *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    _::Debug::Fault::init
              (&local_c0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal(&local_c0);
  }
LAB_00215d30:
  TVar2 = modeToType(local_a8.st_mode);
  (this->fd).fd = TVar2;
  this[1].fd.fd = (undefined4)local_a8.st_size;
  this[1].fd.unwindDetector = (UnwindDetector)local_a8.st_size._4_4_;
  this[2].fd = (AutoCloseFd)(local_a8.st_blocks << 9);
  this[3].fd = (AutoCloseFd)(local_a8.st_mtim.tv_sec * 1000000000 + local_a8.st_mtim.tv_nsec);
  this[4].fd.fd = (int)local_a8.st_nlink;
  this[5].fd = (AutoCloseFd)((local_a8.st_dev << 0x20 | local_a8.st_dev >> 0x20) ^ local_a8.st_ino);
  return TVar2;
}

Assistant:

FsNode::Metadata stat() const {
    struct stat stats;
    KJ_SYSCALL(::fstat(fd, &stats));
    return statToMetadata(stats);
  }